

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

double despot::POMCP::Rollout
                 (State *particle,RandomStreams *streams,int depth,DSPOMDP *model,POMCPPrior *prior)

{
  DSPOMDP *model_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  log_ostream *plVar4;
  ostream *poVar5;
  double dVar6;
  double reward;
  OBS_TYPE obs;
  double local_50;
  double local_48;
  DSPOMDP *local_40;
  undefined8 local_38;
  
  bVar1 = RandomStreams::Exhausted(streams);
  dVar6 = 0.0;
  if (!bVar1) {
    local_40 = model;
    uVar2 = POMCPPrior::GetAction(prior,particle);
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar4 = logging::stream(4);
      poVar5 = despot::operator<<(&plVar4->super_ostream,particle);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    iVar3 = logging::level();
    if ((0 < iVar3) && (iVar3 = logging::level(), 3 < iVar3)) {
      plVar4 = logging::stream(4);
      poVar5 = std::operator<<(&plVar4->super_ostream,"depth = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,depth);
      poVar5 = std::operator<<(poVar5,"; action = ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    RandomStreams::Entry(streams,particle->scenario_id);
    model_00 = local_40;
    iVar3 = (*local_40->_vptr_DSPOMDP[2])(local_40,particle,(ulong)uVar2,&local_50,&local_38);
    dVar6 = local_50;
    if ((char)iVar3 == '\0') {
      (*prior->_vptr_POMCPPrior[6])(prior,(ulong)uVar2,local_38);
      RandomStreams::Advance(streams);
      local_48 = DAT_0019fdd8;
      dVar6 = Rollout(particle,streams,depth + 1,model_00,prior);
      local_50 = dVar6 * local_48 + local_50;
      RandomStreams::Back(streams);
      (*prior->_vptr_POMCPPrior[7])(prior);
      dVar6 = local_50;
    }
  }
  return dVar6;
}

Assistant:

double POMCP::Rollout(State* particle, RandomStreams& streams, int depth,
	const DSPOMDP* model, POMCPPrior* prior) {
	if (streams.Exhausted()) {
		return 0;
	}

	ACT_TYPE action = prior->GetAction(*particle);

	logd << *particle << endl;
	logd << "depth = " << depth << "; action = " << action << endl;

	double reward;
	OBS_TYPE obs;
	bool terminal = model->Step(*particle, streams.Entry(particle->scenario_id),
		action, reward, obs);
	if (!terminal) {
		prior->Add(action, obs);
		streams.Advance();
		reward += Globals::Discount()
			* Rollout(particle, streams, depth + 1, model, prior);
		streams.Back();
		prior->PopLast();
	}

	return reward;
}